

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt.cpp
# Opt level: O3

uint crnlib::dxt5_block::get_block_values6(color_quad_u8 *pDst,uint l,uint h)

{
  (pDst->field_0).field_0.a = (uchar)l;
  pDst[1].field_0.field_0.a = (uchar)h;
  pDst[2].field_0.field_0.a = (uchar)((h + l * 4) / 5);
  pDst[3].field_0.field_0.a = (uchar)((ulong)(l * 3 + h * 2) / 5);
  pDst[4].field_0.field_0.a = (uchar)((ulong)(h * 3 + l * 2) / 5);
  pDst[5].field_0.field_0.a = (uchar)((l + h * 4) / 5);
  pDst[6].field_0.field_0.a = '\0';
  pDst[7].field_0.field_0.a = 0xff;
  return 6;
}

Assistant:

uint dxt5_block::get_block_values6(color_quad_u8* pDst, uint l, uint h)
    {
        pDst[0].a = static_cast<uint8>(l);
        pDst[1].a = static_cast<uint8>(h);
        pDst[2].a = static_cast<uint8>((l * 4 + h) / 5);
        pDst[3].a = static_cast<uint8>((l * 3 + h * 2) / 5);
        pDst[4].a = static_cast<uint8>((l * 2 + h * 3) / 5);
        pDst[5].a = static_cast<uint8>((l + h * 4) / 5);
        pDst[6].a = 0;
        pDst[7].a = 255;
        return 6;
    }